

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int entity5(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok == 0xf) {
    return 0xb;
  }
  if (tok == 0x11) {
    iVar1 = 0xf;
    pcVar2 = internalSubset;
  }
  else {
    if (tok == 0x12) {
      iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"NDATA");
      if (iVar1 != 0) {
        iVar1 = 0xb;
        pcVar2 = entity6;
        goto LAB_004dcbb0;
      }
    }
    iVar1 = -1;
    pcVar2 = error;
  }
LAB_004dcbb0:
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static int PTRCALL
entity5(PROLOG_STATE *state,
        int tok,
        const char *ptr,
        const char *end,
        const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ENTITY_NONE;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_ENTITY_COMPLETE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_NDATA)) {
      state->handler = entity6;
      return XML_ROLE_ENTITY_NONE;
    }
    break;
  }
  return common(state, tok);
}